

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Exscan(void *sendbuf,void *recvbuf,int count,MPIABI_Datatype datatype,MPIABI_Op op,
                 MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Exscan();
  return iVar1;
}

Assistant:

int MPIABI_Exscan(
  const void * sendbuf,
  void * recvbuf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Op op,
  MPIABI_Comm comm
) {
  return MPI_Exscan(
    sendbuf,
    recvbuf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Comm)(WPI_Comm)comm
  );
}